

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall
IntBoundCheck::SetBoundOffset(IntBoundCheck *this,int offset,bool isLoopCountBasedBound)

{
  Instr *this_00;
  code *pcVar1;
  IntConstType IVar2;
  bool bVar3;
  IRType IVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  long lVar8;
  IntConstOpnd *newDst;
  IntConstOpnd *local_80;
  long local_60;
  IntConstType newDstValue;
  IntConstType newSrc1Value;
  IntConstType offsetDecrease;
  IntConstOpnd *src2Opnd;
  IntConstOpnd *src1Opnd;
  long lStack_30;
  IRType offsetType;
  IntConstType previousOffset;
  IntConstOpnd *dstOpnd;
  bool isLoopCountBasedBound_local;
  IntBoundCheck *pIStack_18;
  int offset_local;
  IntBoundCheck *this_local;
  
  dstOpnd._3_1_ = isLoopCountBasedBound;
  dstOpnd._4_4_ = offset;
  pIStack_18 = this;
  bVar3 = IsValid(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x2e5,"(IsValid())","IsValid()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  previousOffset = 0;
  lStack_30 = 0;
  src1Opnd._7_1_ = TyInt64;
  pOVar7 = IR::Instr::GetDst(this->instr);
  if (pOVar7 != (Opnd *)0x0) {
    pOVar7 = IR::Instr::GetDst(this->instr);
    previousOffset = (IntConstType)IR::Opnd::AsIntConstOpnd(pOVar7);
    lStack_30 = IR::EncodableOpnd<long>::GetValue
                          (&((IntConstOpnd *)previousOffset)->super_EncodableOpnd<long>);
    src1Opnd._7_1_ = IR::Opnd::GetType((Opnd *)previousOffset);
  }
  src2Opnd = (IntConstOpnd *)0x0;
  pOVar7 = IR::Instr::GetSrc1(this->instr);
  bVar3 = IR::Opnd::IsIntConstOpnd(pOVar7);
  if (bVar3) {
    pOVar7 = IR::Instr::GetSrc1(this->instr);
    src2Opnd = IR::Opnd::AsIntConstOpnd(pOVar7);
    IVar2 = lStack_30;
    lVar8 = IR::EncodableOpnd<long>::GetValue(&src2Opnd->super_EncodableOpnd<long>);
    IVar4 = IR::Opnd::GetType(&src2Opnd->super_Opnd);
    bVar3 = IntConstMath::Sub(IVar2,lVar8,IVar4,&stack0xffffffffffffffd0);
    if (bVar3) {
      return false;
    }
    src1Opnd._7_1_ = IR::Opnd::GetType(&src2Opnd->super_Opnd);
  }
  pOVar7 = IR::Instr::GetSrc2(this->instr);
  bVar3 = IR::Opnd::IsIntConstOpnd(pOVar7);
  if (bVar3) {
    pOVar7 = IR::Instr::GetSrc2(this->instr);
    local_80 = IR::Opnd::AsIntConstOpnd(pOVar7);
  }
  else {
    local_80 = (IntConstOpnd *)0x0;
  }
  IVar2 = lStack_30;
  offsetDecrease = (IntConstType)local_80;
  if (local_80 != (IntConstOpnd *)0x0) {
    lVar8 = IR::EncodableOpnd<long>::GetValue(&local_80->super_EncodableOpnd<long>);
    IVar4 = IR::Opnd::GetType((Opnd *)offsetDecrease);
    bVar3 = IntConstMath::Add(IVar2,lVar8,IVar4,&stack0xffffffffffffffd0);
    if (bVar3) {
      return false;
    }
  }
  if (dstOpnd._4_4_ < lStack_30) {
    bVar3 = IntConstMath::Sub(lStack_30,(long)dstOpnd._4_4_,src1Opnd._7_1_,&newSrc1Value);
    if (bVar3) {
      this_local._7_1_ = false;
    }
    else {
      if (newSrc1Value < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                           ,0x309,"(offsetDecrease > 0)","offsetDecrease > 0");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (src2Opnd == (IntConstOpnd *)0x0) {
        if (previousOffset == 0) {
          this_00 = this->instr;
          newDst = IR::IntConstOpnd::New(-newSrc1Value,TyInt64,this->instr->m_func,true);
          IR::Instr::SetDst(this_00,&newDst->super_Opnd);
        }
        else {
          lVar8 = IR::EncodableOpnd<long>::GetValue((EncodableOpnd<long> *)(previousOffset + 0x10));
          IVar4 = IR::Opnd::GetType((Opnd *)previousOffset);
          bVar3 = IntConstMath::Sub(lVar8,newSrc1Value,IVar4,&local_60);
          if (bVar3) {
            return false;
          }
          if (local_60 == 0) {
            IR::Instr::FreeDst(this->instr);
          }
          else {
            IR::IntConstOpnd::SetValue((IntConstOpnd *)previousOffset,local_60);
          }
        }
      }
      else {
        lVar8 = IR::EncodableOpnd<long>::GetValue(&src2Opnd->super_EncodableOpnd<long>);
        IVar4 = IR::Opnd::GetType(&src2Opnd->super_Opnd);
        bVar3 = IntConstMath::Add(lVar8,newSrc1Value,IVar4,&newDstValue);
        if (bVar3) {
          return false;
        }
        IR::IntConstOpnd::SetValue(src2Opnd,newDstValue);
      }
      BVar5 = IR::Instr::GetBailOutKind(this->instr);
      if (BVar5 == BailOutOnFailedHoistedBoundCheck) {
        if ((dstOpnd._3_1_ & 1) != 0) {
          IR::Instr::SetBailOutKind(this->instr,BailOutOnFailedHoistedLoopCountBasedBoundCheck);
        }
      }
      else if (BVar5 != BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
        BVar5 = BailOutOnFailedHoistedBoundCheck;
        if ((dstOpnd._3_1_ & 1) != 0) {
          BVar5 = BailOutOnFailedHoistedLoopCountBasedBoundCheck;
        }
        IR::Instr::SetBailOutKind(this->instr,BVar5);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IntBoundCheck::SetBoundOffset(const int offset, const bool isLoopCountBasedBound) const
{
    Assert(IsValid());

    // Determine the previous offset from the instruction (src1 <= src2 + dst)
    IR::IntConstOpnd *dstOpnd = nullptr;
    IntConstType previousOffset = 0;
    IRType offsetType = TyMachReg;
    if (instr->GetDst())
    {
        dstOpnd = instr->GetDst()->AsIntConstOpnd();
        previousOffset = dstOpnd->GetValue();
        offsetType = dstOpnd->GetType();
    }

    IR::IntConstOpnd *src1Opnd = nullptr;
    if (instr->GetSrc1()->IsIntConstOpnd())
    {
        src1Opnd = instr->GetSrc1()->AsIntConstOpnd();
        if (IntConstMath::Sub(previousOffset, src1Opnd->GetValue(), src1Opnd->GetType(), &previousOffset))
            return false;
        offsetType = src1Opnd->GetType();
    }

    IR::IntConstOpnd *src2Opnd = (instr->GetSrc2()->IsIntConstOpnd() ? instr->GetSrc2()->AsIntConstOpnd() : nullptr);
    if(src2Opnd && IntConstMath::Add(previousOffset, src2Opnd->GetValue(), src2Opnd->GetType(), &previousOffset))
        return false;

    // Given a bounds check (a <= b + offset), the offset may only be decreased such that it does not invalidate the invariant
    // previously established by the check. If the offset needs to be increased, that requirement is already satisfied by the
    // previous check.
    if(offset >= previousOffset)
        return true;

    IntConstType offsetDecrease;
    if(IntConstMath::Sub(previousOffset, offset, offsetType, &offsetDecrease))
        return false;

    Assert(offsetDecrease > 0);
    if(src1Opnd)
    {
        // Prefer to increase src1, as this is an upper bound check and src1 corresponds to the index
        IntConstType newSrc1Value;
        if(IntConstMath::Add(src1Opnd->GetValue(), offsetDecrease, src1Opnd->GetType(), &newSrc1Value))
            return false;
        src1Opnd->SetValue(newSrc1Value);
    }
    else if(dstOpnd)
    {
        IntConstType newDstValue;
        if(IntConstMath::Sub(dstOpnd->GetValue(), offsetDecrease, dstOpnd->GetType(), &newDstValue))
            return false;
        if (newDstValue == 0)
            instr->FreeDst();
        else
            dstOpnd->SetValue(newDstValue);
    }
    else
        instr->SetDst(IR::IntConstOpnd::New(-offsetDecrease, TyMachReg, instr->m_func, true));

    switch(instr->GetBailOutKind())
    {
        case IR::BailOutOnFailedHoistedBoundCheck:
            if(isLoopCountBasedBound)
                instr->SetBailOutKind(IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);
            break;

        case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
            break;

        default:
            instr->SetBailOutKind(
                isLoopCountBasedBound
                    ? IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck
                    : IR::BailOutOnFailedHoistedBoundCheck);
            break;
    }
    return true;
}